

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O1

void __thiscall tt::net::Epoll::Epoll(Epoll *this)

{
  int iVar1;
  value_type *__val;
  pointer peVar2;
  long lVar3;
  
  iVar1 = epoll_create1(0x80000);
  this->m_epollFd = iVar1;
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar2 = (pointer)operator_new(0xc000);
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = peVar2;
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar2;
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = peVar2 + 0x1000;
  *(undefined8 *)peVar2 = 0;
  *(undefined4 *)((long)&peVar2->data + 4) = 0;
  lVar3 = 0xc;
  do {
    *(undefined4 *)((long)&peVar2->data + lVar3 + 4) = *(undefined4 *)((long)&peVar2->data + 4);
    *(undefined8 *)((long)&peVar2->events + lVar3) = *(undefined8 *)peVar2;
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0xc000);
  (this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar2 + 0x1000;
  memset(this->m_fd2chan,0,1600000);
  memset(this->m_fd2http,0,1600000);
  TimerManager::TimerManager(&this->m_timeManager);
  if (0 < this->m_epollFd) {
    return;
  }
  __assert_fail("m_epollFd > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/Epoll.cc"
                ,0x1b,"tt::net::Epoll::Epoll()");
}

Assistant:

Epoll::Epoll()
	:m_epollFd(epoll_create1(EPOLL_CLOEXEC)),
	m_events(EVENTSNUM){
	
	assert(m_epollFd > 0);	
}